

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O3

long __thiscall
cubeb_client::user_data_cb
          (cubeb_client *this,cubeb_stream *stm,void *user,void *input_buffer,void *output_buffer,
          long nframes)

{
  __int_type _Var1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  uint local_64;
  
  iVar7 = (int)nframes;
  if (output_buffer == (void *)0x0 || input_buffer == (void *)0x0) {
    if (output_buffer != (void *)0x0 && input_buffer == (void *)0x0) {
      uVar3 = (this->_channels).super___atomic_base<unsigned_int>._M_i;
      if (iVar7 != 0) {
        uVar2 = this->_total_frames;
        dVar10 = (double)(this->_rate).super___atomic_base<unsigned_int>._M_i;
        local_64 = 0;
        iVar9 = 0;
        do {
          if ((ulong)uVar3 != 0) {
            dVar12 = (double)(uVar2 + iVar9) * 6.283185307179586;
            uVar8 = (ulong)uVar3;
            uVar5 = local_64;
            do {
              dVar11 = sin((dVar12 * 350.0) / dVar10);
              uVar4 = (ulong)uVar5;
              *(float *)((long)output_buffer + uVar4 * 4) = (float)(dVar11 * 0.2);
              dVar11 = sin((dVar12 * 440.0) / dVar10);
              *(float *)((long)output_buffer + uVar4 * 4) =
                   (float)(dVar11 * 0.2 + (double)*(float *)((long)output_buffer + uVar4 * 4));
              uVar5 = uVar5 + 1;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
          iVar9 = iVar9 + 1;
          local_64 = local_64 + uVar3;
        } while (iVar9 != iVar7);
      }
    }
  }
  else if (((this->_latency_testing)._M_base._M_i & 1U) == 0) {
    if (0 < nframes) {
      lVar6 = 0;
      do {
        if ((this->_channels).super___atomic_base<unsigned_int>._M_i != 0) {
          uVar3 = 0;
          do {
            *(undefined4 *)
             ((long)output_buffer +
             (ulong)((this->_channels).super___atomic_base<unsigned_int>._M_i * (int)lVar6 + uVar3)
             * 4) = *(undefined4 *)((long)input_buffer + lVar6 * 4);
            uVar3 = uVar3 + 1;
          } while (uVar3 < (this->_channels).super___atomic_base<unsigned_int>._M_i);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != nframes);
    }
  }
  else if (0 < nframes) {
    lVar6 = 0;
    do {
      iVar9 = (int)lVar6;
      _Var1 = (this->_channels).super___atomic_base<unsigned_int>._M_i;
      if ((this->_total_frames + iVar9) % (this->_rate).super___atomic_base<unsigned_int>._M_i == 0)
      {
        if (_Var1 != 0) {
          uVar3 = 0;
          do {
            *(float *)((long)output_buffer +
                      (ulong)((this->_channels).super___atomic_base<unsigned_int>._M_i * iVar9 +
                             uVar3) * 4) = *(float *)((long)input_buffer + lVar6 * 4) * 0.5 + 1.0;
            uVar3 = uVar3 + 1;
          } while (uVar3 < (this->_channels).super___atomic_base<unsigned_int>._M_i);
        }
      }
      else if (_Var1 != 0) {
        uVar3 = 0;
        do {
          *(float *)((long)output_buffer +
                    (ulong)((this->_channels).super___atomic_base<unsigned_int>._M_i * iVar9 + uVar3
                           ) * 4) = *(float *)((long)input_buffer + lVar6 * 4) * 0.5 + 0.0;
          uVar3 = uVar3 + 1;
        } while (uVar3 < (this->_channels).super___atomic_base<unsigned_int>._M_i);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != nframes);
  }
  this->_total_frames = this->_total_frames + iVar7;
  return nframes - (ulong)((this->_force_drain)._M_base._M_i & 1);
}

Assistant:

long cubeb_client::user_data_cb(cubeb_stream* stm, void* user,
                                const void* input_buffer, void* output_buffer,
                                long nframes) {
  if (input_buffer && output_buffer) {
    const float* in = static_cast<const float*>(input_buffer);
    float* out = static_cast<float*>(output_buffer);
    if (_latency_testing) {
      for (int32_t i = 0; i < nframes; i++) {
        // Impulses every second, mixed with the input signal fed back at half
        // gain, to measure the input-to-output latency via feedback.
        uint32_t clock = ((_total_frames + i) % _rate);
        if (!clock) {
          for (uint32_t j = 0; j < _channels; j++) {
            out[i * _channels + j] = 1.0 + in[i] * 0.5;
          }
        } else {
          for (uint32_t j = 0; j < _channels; j++) {
            out[i * _channels + j] = 0.0 + in[i] * 0.5;
          }
        }
      }
    } else {
      for (int32_t i = 0; i < nframes; i++) {
        for (uint32_t j = 0; j < _channels; j++) {
          out[i * _channels + j] = in[i];
        }
      }
    }
  } else if (output_buffer && !input_buffer) {
    fill_with_sine_tone(static_cast<float*>(output_buffer), nframes, _channels,
                       _rate, _total_frames);
  }

  _total_frames += nframes;

  if (_force_drain) {
    return nframes - 1;
  }

  return nframes;
}